

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Matrix<double,_3,_3,_0,_3,_3> *dst,SrcXprType *src,assign_op<double,_double> *param_3)

{
  Index rows;
  Index cols;
  Index IVar1;
  LhsNestedCleaned *lhs;
  RhsNestedCleaned *rhs;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  SrcXprType *src_local;
  Matrix<double,_3,_3,_0,_3,_3> *dst_local;
  
  rows = Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::
         rows(src);
  cols = Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::
         cols(src);
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>);
  if (IVar1 == rows) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>);
    if (IVar1 == cols) goto LAB_0019017d;
  }
  PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,rows,cols);
LAB_0019017d:
  lhs = Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::lhs
                  (src);
  rhs = Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::rhs
                  (src);
  generic_product_impl<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,Eigen::DenseShape,Eigen::DenseShape,3>
  ::evalTo<Eigen::Matrix<double,3,3,0,3,3>>(dst,lhs,rhs);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }